

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O0

result_type * __thiscall
anon_unknown.dwarf_237ecec::ByTxHashViewExtractor::operator()
          (ByTxHashViewExtractor *this,Announcement *ann)

{
  long lVar1;
  State SVar2;
  uint256 *__elements;
  Announcement *in_RDX;
  PriorityComputer *in_RDI;
  long in_FS_OFFSET;
  Priority prio;
  Announcement *in_stack_ffffffffffffffa8;
  Announcement *in_stack_ffffffffffffffb0;
  PriorityComputer *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  SVar2 = Announcement::GetState(in_stack_ffffffffffffffa8);
  if (SVar2 == CANDIDATE_READY) {
    __elements = (uint256 *)PriorityComputer::operator()(this_00,in_stack_ffffffffffffffb0);
  }
  else {
    __elements = (uint256 *)0x0;
  }
  Announcement::GetState(in_RDX);
  std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>::
  tuple<const_uint256_&,_(anonymous_namespace)::State,_const_unsigned_long_&,_true,_true>
            ((tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long> *)this_00,
             __elements,(State *)in_RDX,(unsigned_long *)0x146b3ac);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (result_type *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

result_type operator()(const Announcement& ann) const
    {
        const Priority prio = (ann.GetState() == State::CANDIDATE_READY) ? m_computer(ann) : 0;
        return ByTxHashView{ann.m_txhash, ann.GetState(), prio};
    }